

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_lzcomp_internal.cpp
# Opt level: O0

int __thiscall
lzham::lzcompressor::raw_parse_thread_state::init(raw_parse_thread_state *this,EVP_PKEY_CTX *ctx)

{
  uint uVar1;
  void *pvVar2;
  node_state *pNodes;
  uint j;
  uint local_24;
  undefined1 local_1;
  
  uVar1 = state::init(&this->m_state,ctx);
  pvVar2 = (void *)(ulong)uVar1;
  if ((uVar1 & 1) == 0) {
    local_1 = 0;
  }
  else {
    if (((byte)ctx[0x3976] & 1) == 0) {
      pvVar2 = memset(this->m_nodes,0xff,0x2a038);
    }
    else {
      for (local_24 = 0; pvVar2 = (void *)(ulong)local_24, pvVar2 < (void *)0xc01;
          local_24 = local_24 + 1) {
        node::clear(this->m_nodes + local_24);
      }
    }
    local_1 = 1;
  }
  return (int)CONCAT71((int7)((ulong)pvVar2 >> 8),local_1);
}

Assistant:

bool lzcompressor::raw_parse_thread_state::init(lzcompressor& lzcomp, const lzcompressor::init_params &params)
   {
      if (!m_state.init(lzcomp, params.m_table_max_update_interval, params.m_table_update_interval_slow_rate))
         return false;

      if (lzcomp.m_use_extreme_parsing)
      {
         for (uint j = 0; j < LZHAM_ARRAY_SIZE(m_nodes); j++)
            m_nodes[j].clear();
      }
      else
      {
         node_state *pNodes = reinterpret_cast<node_state*>(m_nodes);

         memset(pNodes, 0xFF, (1 + cMaxParseGraphNodes) * sizeof(node_state));
      }

      return true;
   }